

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O0

UINT8 __thiscall VGMPlayer::GetSongInfo(VGMPlayer *this,PLR_SONG_INFO *songInf)

{
  UINT32 UVar1;
  double dVar2;
  UINT32 local_34;
  byte local_21;
  UINT8 vgmChip;
  PLR_SONG_INFO *songInf_local;
  VGMPlayer *this_local;
  
  if (this->_dLoad == (DATA_LOADER *)0x0) {
    this_local._7_1_ = 0xff;
  }
  else {
    songInf->format = 0x56474d00;
    songInf->fileVerMaj = (UINT16)((this->_fileHdr).fileVer >> 8);
    songInf->fileVerMin = (ushort)(this->_fileHdr).fileVer & 0xff;
    songInf->tickRateMul = 1;
    songInf->tickRateDiv = 0xac44;
    UVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x1c])();
    songInf->songLen = UVar1;
    if ((this->_fileHdr).loopOfs == 0) {
      local_34 = 0xffffffff;
    }
    else {
      local_34 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x1d])();
    }
    songInf->loopTick = local_34;
    dVar2 = pow(2.0,(double)(int)(this->_fileHdr).volumeGain / 256.0);
    songInf->volGain = (int)(dVar2 * 65536.0 + 0.5);
    songInf->deviceCnt = 0;
    for (local_21 = 0; local_21 < 0x2a; local_21 = local_21 + 1) {
      UVar1 = GetChipCount(this,local_21);
      songInf->deviceCnt = UVar1 + songInf->deviceCnt;
    }
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UINT8 VGMPlayer::GetSongInfo(PLR_SONG_INFO& songInf)
{
	if (_dLoad == NULL)
		return 0xFF;
	
	UINT8 vgmChip;
	
	songInf.format = FCC_VGM;
	songInf.fileVerMaj = (_fileHdr.fileVer >> 8) & 0xFFFFFF;
	songInf.fileVerMin = (_fileHdr.fileVer >> 0) & 0xFF;
	songInf.tickRateMul = 1;
	songInf.tickRateDiv = 44100;
	songInf.songLen = GetTotalTicks();
	songInf.loopTick = _fileHdr.loopOfs ? GetLoopTicks() : (UINT32)-1;
	songInf.volGain = (INT32)(0x10000 * pow(2.0, _fileHdr.volumeGain / (double)0x100) + 0.5);
	songInf.deviceCnt = 0;
	for (vgmChip = 0x00; vgmChip < _CHIP_COUNT; vgmChip ++)
		songInf.deviceCnt += GetChipCount(vgmChip);
	
	return 0x00;
}